

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFramebufferDefaultStateQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::FramebufferTest::iterate(FramebufferTest *this)

{
  TestLog *pTVar1;
  int iVar2;
  GLenum err;
  undefined4 extraout_var;
  allocator<char> local_da;
  allocator<char> local_d9;
  ScopedLogSection section;
  string local_d0;
  CallLogWrapper gl;
  string local_98;
  Framebuffer fbo;
  ResultCollector result;
  
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
            (&fbo,((this->super_TestCase).m_context)->m_renderCtx);
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar2),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0," // ERROR: ",(allocator<char> *)&local_98);
  tcu::ResultCollector::ResultCollector(&result,pTVar1,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  gl.m_enableLog = true;
  glu::CallLogWrapper::glBindFramebuffer(&gl,0x8ca9,fbo.super_ObjectWrapper.m_object);
  err = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(err,"bind",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fFramebufferDefaultStateQueryTests.cpp"
                  ,0x52);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"Initial",&local_d9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"Initial",&local_da);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,&local_d0,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_d0);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this,&result,&gl);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"Set",&local_d9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"Set",&local_da);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,&local_d0,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_d0);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(this,&result,&gl);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  tcu::ResultCollector::setTestContextResult
            (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector(&result);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  glu::ObjectWrapper::~ObjectWrapper(&fbo.super_ObjectWrapper);
  return STOP;
}

Assistant:

FramebufferTest::IterateResult FramebufferTest::iterate (void)
{
	glu::Framebuffer		fbo		(m_context.getRenderContext());
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	gl.glBindFramebuffer(GL_DRAW_FRAMEBUFFER, *fbo);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "bind");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		checkInitial(result, gl);
	}

	{
		const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Set", "Set");
		checkSet(result, gl);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}